

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Concat_x86::forward
          (Concat_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  const_reference pvVar1;
  size_type sVar2;
  unsigned_long *puVar3;
  int *piVar4;
  long in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  bool bVar5;
  float *ptr_5;
  Mat *bottom_blob_11;
  size_t b_11;
  int i_3;
  float *outptr_5;
  int q_2;
  Mat *top_blob_5;
  Mat *bottom_blob_10;
  size_t b_10;
  int top_w_2;
  int elempack_5;
  size_t elemsize_5;
  int channels_1;
  int h_2;
  float *ptr_4;
  int size_3;
  Mat *bottom_blob_9;
  size_t b_9;
  float *outptr_4;
  int q_1;
  Mat *top_blob_4;
  Mat *bottom_blob_8;
  size_t b_8;
  int top_h_1;
  int elempack_4;
  size_t elemsize_4;
  int channels;
  int w_2;
  float *outptr_3;
  float *ptr_3;
  int size_2;
  int i_2;
  float *outptr3_1;
  float *outptr2_1;
  float *outptr1_1;
  float *outptr0_1;
  float *r0_1;
  int q;
  int size_1;
  Mat *bottom_blob_7;
  size_t b_7;
  int p;
  Mat top_blob_unpacked_1;
  Mat *top_blob_3;
  size_t out_elemsize_2;
  int out_elempack_2;
  Mat *bottom_blob_6;
  size_t b_6;
  int top_channels;
  int elempack_3;
  size_t elemsize_3;
  int h_1;
  int w_1;
  float *ptr_2;
  Mat *bottom_blob_5;
  size_t b_5;
  float *outptr_2;
  int i_1;
  Mat *top_blob_2;
  Mat *bottom_blob_4;
  size_t b_4;
  int top_w_1;
  int elempack_2;
  size_t elemsize_2;
  int h;
  float *ptr_1;
  int size;
  int j;
  float *outptr3;
  float *outptr2;
  float *outptr1;
  float *outptr0;
  float *r0;
  int i;
  Mat *bottom_blob_3;
  size_t b_3;
  float *outptr_1;
  Mat top_blob_unpacked;
  Mat *top_blob_1;
  size_t out_elemsize_1;
  int out_elempack_1;
  Mat *bottom_blob_2;
  size_t b_2;
  int top_h;
  int elempack_1;
  size_t elemsize_1;
  int w;
  float *ptr;
  Mat *bottom_blob_1;
  size_t b_1;
  float *outptr;
  Mat *top_blob;
  size_t out_elemsize;
  int out_elempack;
  Mat *bottom_blob;
  size_t b;
  int top_w;
  int elempack;
  size_t elemsize;
  int positive_axis;
  int dims;
  Mat *m_9;
  Mat *m_7;
  Mat *m;
  Mat *m_8;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Allocator *in_stack_ffffffffffffed50;
  int _elempack;
  size_t in_stack_ffffffffffffed58;
  size_t in_stack_ffffffffffffed60;
  int _c;
  Option *in_stack_ffffffffffffed68;
  ulong uVar6;
  Mat *in_stack_ffffffffffffed70;
  Mat *in_stack_ffffffffffffed78;
  Mat *in_stack_ffffffffffffed80;
  const_reference in_stack_ffffffffffffedd0;
  int local_fcc;
  undefined8 local_fc0;
  undefined8 local_fb8;
  undefined8 local_fb0;
  undefined4 local_fa8;
  Allocator *local_fa0;
  undefined4 local_f98;
  undefined4 local_f94;
  undefined4 local_f90;
  undefined4 local_f8c;
  undefined4 local_f88;
  undefined8 local_f80;
  void *local_f78;
  const_reference local_f70;
  ulong local_f68;
  int local_f5c;
  undefined8 local_f58;
  undefined8 local_f50;
  undefined8 local_f48;
  undefined4 local_f40;
  Allocator *local_f38;
  undefined4 local_f30;
  undefined4 local_f2c;
  undefined4 local_f28;
  undefined4 local_f24;
  undefined4 local_f20;
  undefined8 local_f18;
  void *local_f10;
  int local_f04;
  reference local_f00;
  const_reference local_ef8;
  ulong local_ef0;
  int local_ee8;
  int local_ee4;
  size_t local_ee0;
  int local_ed8;
  int local_ed4;
  undefined8 local_ed0;
  undefined8 local_ec8;
  undefined8 local_ec0;
  undefined4 local_eb8;
  Allocator *local_eb0;
  undefined4 local_ea8;
  undefined4 local_ea4;
  undefined4 local_ea0;
  undefined4 local_e9c;
  undefined4 local_e98;
  undefined8 local_e90;
  void *local_e88;
  int local_e7c;
  const_reference local_e78;
  ulong local_e70;
  undefined8 local_e68;
  undefined8 local_e60;
  undefined8 local_e58;
  undefined4 local_e50;
  Allocator *local_e48;
  undefined4 local_e40;
  undefined4 local_e3c;
  undefined4 local_e38;
  undefined4 local_e34;
  undefined4 local_e30;
  undefined8 local_e28;
  void *local_e20;
  int local_e14;
  reference local_e10;
  const_reference local_e08;
  ulong local_e00;
  int local_df8;
  int local_df4;
  size_t local_df0;
  int local_de8;
  int local_de4;
  undefined8 local_de0;
  undefined8 local_dd8;
  undefined8 local_dd0;
  undefined4 local_dc8;
  Allocator *local_dc0;
  undefined4 local_db8;
  undefined4 local_db4;
  undefined4 local_db0;
  undefined4 local_dac;
  undefined4 local_da8;
  undefined8 local_da0;
  void *local_d98;
  void *local_d90;
  int local_d88;
  int local_d84;
  undefined8 local_d80;
  undefined8 local_d78;
  undefined8 local_d70;
  undefined4 local_d68;
  Allocator *local_d60;
  undefined4 local_d58;
  undefined4 local_d54;
  undefined4 local_d50;
  undefined4 local_d4c;
  undefined4 local_d48;
  undefined8 local_d40;
  undefined4 *local_d38;
  undefined8 local_d30;
  undefined8 local_d28;
  undefined8 local_d20;
  undefined4 local_d18;
  Allocator *local_d10;
  undefined4 local_d08;
  undefined4 local_d04;
  undefined4 local_d00;
  undefined4 local_cfc;
  undefined4 local_cf8;
  undefined8 local_cf0;
  undefined4 *local_ce8;
  undefined8 local_ce0;
  undefined8 local_cd8;
  undefined8 local_cd0;
  undefined4 local_cc8;
  Allocator *local_cc0;
  undefined4 local_cb8;
  undefined4 local_cb4;
  undefined4 local_cb0;
  undefined4 local_cac;
  undefined4 local_ca8;
  undefined8 local_ca0;
  undefined4 *local_c98;
  undefined8 local_c90;
  undefined8 local_c88;
  undefined8 local_c80;
  undefined4 local_c78;
  Allocator *local_c70;
  undefined4 local_c68;
  undefined4 local_c64;
  undefined4 local_c60;
  undefined4 local_c5c;
  undefined4 local_c58;
  undefined8 local_c50;
  undefined4 *local_c48;
  undefined8 local_c40;
  undefined8 local_c38;
  undefined8 local_c30;
  undefined4 local_c28;
  Allocator *local_c20;
  undefined4 local_c18;
  undefined4 local_c14;
  undefined4 local_c10;
  undefined4 local_c0c;
  undefined4 local_c08;
  undefined8 local_c00;
  undefined4 *local_bf8;
  int local_bf0;
  int local_bec;
  const_reference local_be8;
  ulong local_be0;
  int local_bd4;
  void *local_bd0;
  int *local_bc8;
  size_t local_bc0;
  int local_bb8;
  Allocator *local_bb0;
  int local_ba8;
  int local_ba4;
  int local_ba0;
  int local_b9c;
  int local_b98;
  size_t local_b90;
  reference local_b88;
  long local_b80;
  int local_b74;
  const_reference local_b70;
  ulong local_b68;
  int local_b60;
  int local_b5c;
  size_t local_b58;
  int local_b50;
  int local_b4c;
  void *local_b48;
  const_reference local_b40;
  ulong local_b38;
  void *local_b30;
  int local_b24;
  reference local_b20;
  const_reference local_b18;
  ulong local_b10;
  int local_b08;
  int local_b04;
  size_t local_b00;
  int local_af4;
  void *local_af0;
  int local_ae8;
  int local_ae4;
  undefined4 *local_ae0;
  undefined4 *local_ad8;
  undefined4 *local_ad0;
  undefined4 *local_ac8;
  undefined4 *local_ac0;
  int local_ab4;
  const_reference local_ab0;
  ulong local_aa8;
  undefined4 *local_aa0;
  int local_a98;
  undefined4 *local_a88;
  int *local_a80;
  size_t local_a78;
  int local_a70;
  Allocator *local_a68;
  int local_a60;
  int local_a5c;
  int local_a58;
  int local_a54;
  int local_a50;
  size_t local_a48;
  reference local_a40;
  long local_a38;
  int local_a2c;
  const_reference local_a28;
  ulong local_a20;
  int local_a18;
  int local_a14;
  size_t local_a10;
  int local_a04;
  void *local_a00;
  const_reference local_9f8;
  ulong local_9f0;
  void *local_9e8;
  reference local_9e0;
  long local_9d8;
  int local_9cc;
  const_reference local_9c8;
  ulong local_9c0;
  int local_9b8;
  int local_9b4;
  size_t local_9b0;
  int local_9a8;
  int local_9a4;
  long local_9a0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_998;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_990;
  int local_97c;
  reference local_978;
  reference local_970;
  void **local_968;
  reference local_960;
  reference local_958;
  undefined4 **local_950;
  reference local_948;
  reference local_940;
  undefined8 *local_938;
  undefined8 *local_930;
  undefined8 *local_928;
  undefined8 *local_920;
  undefined8 *local_918;
  undefined8 *local_910;
  undefined8 *local_908;
  undefined4 **local_900;
  reference local_8f8;
  undefined8 *local_8f0;
  const_reference local_8e8;
  undefined8 *local_8e0;
  const_reference local_8d8;
  const_reference local_8d0;
  reference local_8c8;
  undefined4 **local_8c0;
  reference local_8b8;
  void **local_8b0;
  int local_8a4;
  undefined8 *local_8a0;
  int local_894;
  const_reference local_890;
  int local_884;
  const_reference local_880;
  undefined4 **local_878;
  undefined8 *local_868;
  undefined8 *local_858;
  undefined8 *local_848;
  undefined8 *local_838;
  undefined8 *local_828;
  undefined8 *local_818;
  void **local_808;
  undefined8 *local_7f8;
  undefined8 *local_7e8;
  undefined8 *local_7d8;
  undefined8 *local_7c8;
  int local_7b4;
  reference local_7b0;
  undefined1 local_7a5;
  int local_7a4;
  const_reference local_7a0;
  undefined8 *local_798;
  undefined1 local_785;
  int local_784;
  const_reference local_780;
  undefined8 *local_778;
  undefined1 local_765;
  int local_764;
  const_reference local_760;
  undefined8 *local_758;
  undefined1 local_745;
  int local_744;
  reference local_740;
  undefined8 *local_738;
  undefined1 local_725;
  int local_724;
  reference local_720;
  undefined8 *local_718;
  undefined1 local_705;
  int local_704;
  void **local_700;
  undefined8 *local_6f8;
  undefined1 local_6e5;
  int local_6e4;
  void **local_6e0;
  undefined8 *local_6d8;
  undefined1 local_6c5;
  int local_6c4;
  void **local_6c0;
  undefined8 *local_6b8;
  undefined1 local_6a5;
  int local_6a4;
  void **local_6a0;
  undefined8 *local_698;
  undefined1 local_685;
  int local_684;
  void **local_680;
  undefined8 *local_678;
  reference local_668;
  reference local_660;
  undefined4 **local_658;
  reference local_650;
  reference local_648;
  void **local_640;
  reference local_638;
  reference local_630;
  const_reference local_628;
  int local_620;
  undefined4 local_61c;
  void **local_618;
  int local_610;
  undefined4 local_60c;
  undefined4 **local_608;
  undefined8 *local_548;
  undefined8 *local_528;
  undefined8 *local_508;
  undefined8 *local_4e8;
  int local_4d0;
  undefined4 local_4cc;
  void **local_4c8;
  undefined8 *local_4a8;
  undefined8 *local_488;
  undefined8 *local_468;
  undefined8 *local_448;
  undefined8 *local_428;
  undefined8 *local_408;
  int local_3f0;
  undefined4 local_3ec;
  undefined4 **local_3e8;
  undefined4 *local_3e0;
  void *local_370;
  Allocator *local_2d0;
  int local_2c4;
  size_t local_2c0;
  undefined4 *local_2b8;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  undefined8 *local_2a0;
  Allocator *local_298;
  int local_28c;
  size_t local_288;
  undefined4 *local_280;
  int local_274;
  int local_270;
  int local_26c;
  undefined8 *local_268;
  Allocator *local_260;
  int local_254;
  size_t local_250;
  undefined4 *local_248;
  int local_23c;
  int local_238;
  int local_234;
  undefined8 *local_230;
  Allocator *local_228;
  int local_21c;
  size_t local_218;
  undefined4 *local_210;
  int local_204;
  int local_200;
  int local_1fc;
  undefined8 *local_1f8;
  Allocator *local_1f0;
  int local_1e4;
  size_t local_1e0;
  void *local_1d8;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  undefined8 *local_1c0;
  Allocator *local_1b8;
  int local_1ac;
  size_t local_1a8;
  void *local_1a0;
  int local_194;
  int local_190;
  int local_18c;
  undefined8 *local_188;
  Allocator *local_180;
  int local_174;
  size_t local_170;
  void *local_168;
  int local_15c;
  int local_158;
  int local_154;
  undefined8 *local_150;
  Allocator *local_148;
  int local_13c;
  size_t local_138;
  undefined4 *local_130;
  int local_124;
  int local_120;
  int local_11c;
  undefined8 *local_118;
  Allocator *local_110;
  int local_104;
  size_t local_100;
  void *local_f8;
  int local_ec;
  int local_e8;
  int local_e4;
  undefined8 *local_e0;
  Allocator *local_d8;
  int local_cc;
  size_t local_c8;
  void *local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  undefined8 *local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_9a0 = in_RCX;
  local_998 = in_RDX;
  local_990 = in_RSI;
  pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_9a4 = pvVar1->dims;
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 0) {
    local_fcc = local_9a4 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
  }
  else {
    local_fcc = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
  }
  local_9a8 = local_fcc;
  if (local_9a4 == 1) {
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
    local_9b0 = pvVar1->elemsize;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
    local_9b4 = pvVar1->elempack;
    local_9b8 = 0;
    for (local_9c0 = 0; uVar6 = local_9c0,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_990), uVar6 < sVar2;
        local_9c0 = local_9c0 + 1) {
      local_9c8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_990,local_9c0);
      local_9b8 = local_9c8->w * local_9c8->elempack + local_9b8;
    }
    local_9cc = 1;
    if (((*(byte *)(local_9a0 + 0x27) & 1) != 0) && (local_9cc = 1, local_9b8 % 4 == 0)) {
      local_9cc = 4;
    }
    local_9d8 = (local_9b0 / (ulong)(long)local_9b4) * (long)local_9cc;
    local_9e0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_998,0);
    Mat::create(in_stack_ffffffffffffed70,(int)((ulong)in_stack_ffffffffffffed68 >> 0x20),
                in_stack_ffffffffffffed60,(int)(in_stack_ffffffffffffed58 >> 0x20),
                in_stack_ffffffffffffed50);
    local_940 = local_9e0;
    bVar5 = true;
    if (local_9e0->data != (void *)0x0) {
      local_668 = local_9e0;
      bVar5 = local_9e0->cstep * (long)local_9e0->c == 0;
    }
    if (bVar5) {
      return -100;
    }
    local_8f8 = local_9e0;
    local_9e8 = local_9e0->data;
    for (local_9f0 = 0; uVar6 = local_9f0,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_990), uVar6 < sVar2;
        local_9f0 = local_9f0 + 1) {
      local_9f8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_990,local_9f0);
      local_a00 = local_9f8->data;
      local_8d0 = local_9f8;
      memcpy(local_9e8,local_a00,(long)local_9f8->w * local_9f8->elemsize);
      local_9e8 = (void *)((long)local_9e8 + (long)(local_9f8->w * local_9f8->elempack) * 4);
    }
  }
  if ((local_9a4 == 2) && (local_9a8 == 0)) {
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
    local_a04 = pvVar1->w;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
    local_a10 = pvVar1->elemsize;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
    local_a14 = pvVar1->elempack;
    local_a18 = 0;
    for (local_a20 = 0; uVar6 = local_a20,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_990), uVar6 < sVar2;
        local_a20 = local_a20 + 1) {
      local_a28 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_990,local_a20);
      puVar3 = std::min<unsigned_long>(&local_a10,&local_a28->elemsize);
      local_a10 = *puVar3;
      piVar4 = std::min<int>(&local_a14,&local_a28->elempack);
      local_a14 = *piVar4;
      local_a18 = local_a28->h * local_a28->elempack + local_a18;
    }
    local_a2c = 1;
    if (((*(byte *)(local_9a0 + 0x27) & 1) != 0) && (local_a2c = 1, local_a18 % 4 == 0)) {
      local_a2c = 4;
    }
    local_a38 = (local_a10 / (ulong)(long)local_a14) * (long)local_a2c;
    local_a40 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_998,0);
    Mat::create(in_stack_ffffffffffffed70,(int)((ulong)in_stack_ffffffffffffed68 >> 0x20),
                (int)in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
                (int)(in_stack_ffffffffffffed58 >> 0x20),in_stack_ffffffffffffed50);
    local_948 = local_a40;
    bVar5 = true;
    if (local_a40->data != (void *)0x0) {
      local_660 = local_a40;
      bVar5 = local_a40->cstep * (long)local_a40->c == 0;
    }
    if (bVar5) {
      return -100;
    }
    local_8c0 = &local_a88;
    local_8c8 = local_a40;
    local_a88 = (undefined4 *)local_a40->data;
    local_a80 = local_a40->refcount;
    local_a78 = local_a40->elemsize;
    local_a70 = local_a40->elempack;
    local_a68 = local_a40->allocator;
    local_a60 = local_a40->dims;
    local_a5c = local_a40->w;
    local_a58 = local_a40->h;
    local_a54 = local_a40->d;
    local_a50 = local_a40->c;
    local_a48 = local_a40->cstep;
    if (local_a80 != (int *)0x0) {
      local_60c = 1;
      LOCK();
      local_610 = *local_a80;
      *local_a80 = *local_a80 + 1;
      UNLOCK();
    }
    local_608 = local_8c0;
    if (local_a14 < local_a2c) {
      Mat::create(in_stack_ffffffffffffed70,(int)((ulong)in_stack_ffffffffffffed68 >> 0x20),
                  (int)in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
                  (int)(in_stack_ffffffffffffed58 >> 0x20),in_stack_ffffffffffffed50);
      local_950 = &local_a88;
      if (local_a88 != (undefined4 *)0x0) {
        local_658 = local_950;
      }
      if (local_a88 != (undefined4 *)0x0 && local_a48 * (long)local_a50 != 0) goto LAB_00206e13;
      local_97c = -100;
      local_a98 = 1;
    }
    else {
LAB_00206e13:
      local_900 = &local_a88;
      local_aa0 = local_a88;
      for (local_aa8 = 0; uVar6 = local_aa8,
          sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_990), uVar6 < sVar2
          ; local_aa8 = local_aa8 + 1) {
        local_ab0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_990,local_aa8);
        if ((local_ab0->elempack == 4) && (local_a14 == 1)) {
          for (local_ab4 = 0; local_ab4 < local_ab0->h; local_ab4 = local_ab4 + 1) {
            local_884 = local_ab4;
            local_ac0 = (undefined4 *)
                        ((long)local_ab0->data +
                        (long)local_ab0->w * (long)local_ab4 * local_ab0->elemsize);
            local_ac8 = local_aa0;
            local_ae0 = local_aa0 + local_a04 * 3;
            local_ad8 = local_aa0 + (local_a04 << 1);
            local_ad0 = local_aa0 + local_a04;
            for (local_ae4 = 0; local_ae4 < local_a04; local_ae4 = local_ae4 + 1) {
              *local_ac8 = *local_ac0;
              *local_ad0 = local_ac0[1];
              *local_ad8 = local_ac0[2];
              *local_ae0 = local_ac0[3];
              local_ac0 = local_ac0 + 4;
              local_ae0 = local_ae0 + 1;
              local_ad8 = local_ad8 + 1;
              local_ad0 = local_ad0 + 1;
              local_ac8 = local_ac8 + 1;
            }
            local_aa0 = local_aa0 + (local_a04 << 2);
            local_880 = local_ab0;
          }
        }
        if (local_ab0->elempack == local_a14) {
          local_ae8 = local_a04 * local_ab0->h;
          local_af0 = local_ab0->data;
          local_8d8 = local_ab0;
          memcpy(local_aa0,local_af0,(long)local_ae8 * local_ab0->elemsize);
          local_aa0 = local_aa0 + local_ae8 * local_ab0->elempack;
        }
      }
      if (local_a14 < local_a2c) {
        convert_packing(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78,
                        (int)((ulong)in_stack_ffffffffffffed70 >> 0x20),in_stack_ffffffffffffed68);
      }
      local_a98 = 0;
    }
    local_878 = &local_a88;
    local_3e8 = local_878;
    if (local_a80 != (int *)0x0) {
      local_3ec = 0xffffffff;
      LOCK();
      local_3f0 = *local_a80;
      *local_a80 = *local_a80 + -1;
      UNLOCK();
      if (local_3f0 == 1) {
        if (local_a68 == (Allocator *)0x0) {
          local_3e0 = local_a88;
          if (local_a88 != (undefined4 *)0x0) {
            free(local_a88);
          }
        }
        else {
          (*local_a68->_vptr_Allocator[3])(local_a68,local_a88);
        }
      }
    }
    local_a88 = (undefined4 *)0x0;
    local_a78 = 0;
    local_a70 = 0;
    local_a60 = 0;
    local_a5c = 0;
    local_a58 = 0;
    local_a54 = 0;
    local_a50 = 0;
    local_a48 = 0;
    local_a80 = (int *)0x0;
    if (local_a98 != 0) {
      return local_97c;
    }
  }
  if ((local_9a4 == 2) && (local_9a8 == 1)) {
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
    local_af4 = pvVar1->h;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
    local_b00 = pvVar1->elemsize;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
    local_b04 = pvVar1->elempack;
    local_b08 = 0;
    for (local_b10 = 0; uVar6 = local_b10,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_990), uVar6 < sVar2;
        local_b10 = local_b10 + 1) {
      local_b18 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_990,local_b10);
      local_b08 = local_b18->w + local_b08;
    }
    local_b20 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_998,0);
    Mat::create(in_stack_ffffffffffffed70,(int)((ulong)in_stack_ffffffffffffed68 >> 0x20),
                (int)in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
                (int)(in_stack_ffffffffffffed58 >> 0x20),in_stack_ffffffffffffed50);
    local_958 = local_b20;
    bVar5 = true;
    if (local_b20->data != (void *)0x0) {
      local_650 = local_b20;
      bVar5 = local_b20->cstep * (long)local_b20->c == 0;
    }
    if (bVar5) {
      return -100;
    }
    for (local_b24 = 0; local_b24 < local_af4; local_b24 = local_b24 + 1) {
      local_7b0 = local_b20;
      local_7b4 = local_b24;
      local_b30 = (void *)((long)local_b20->data +
                          (long)local_b20->w * (long)local_b24 * local_b20->elemsize);
      for (local_b38 = 0; uVar6 = local_b38,
          sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_990), uVar6 < sVar2
          ; local_b38 = local_b38 + 1) {
        local_b40 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_990,local_b38);
        local_894 = local_b24;
        local_b48 = (void *)((long)local_b40->data +
                            (long)local_b40->w * (long)local_b24 * local_b40->elemsize);
        local_890 = local_b40;
        memcpy(local_b30,local_b48,(long)local_b40->w * local_b00);
        local_b30 = (void *)((long)local_b30 + (long)(local_b40->w * local_b04) * 4);
      }
    }
  }
  if ((local_9a4 != 3) || (local_9a8 != 0)) goto LAB_00209b00;
  pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
  local_b4c = pvVar1->w;
  pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
  local_b50 = pvVar1->h;
  pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
  local_b58 = pvVar1->elemsize;
  pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
  local_b5c = pvVar1->elempack;
  local_b60 = 0;
  for (local_b68 = 0; uVar6 = local_b68,
      sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_990), uVar6 < sVar2;
      local_b68 = local_b68 + 1) {
    local_b70 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,local_b68);
    puVar3 = std::min<unsigned_long>(&local_b58,&local_b70->elemsize);
    local_b58 = *puVar3;
    piVar4 = std::min<int>(&local_b5c,&local_b70->elempack);
    local_b5c = *piVar4;
    local_b60 = local_b70->c * local_b70->elempack + local_b60;
  }
  local_b74 = 1;
  if (((*(byte *)(local_9a0 + 0x27) & 1) != 0) && (local_b74 = 1, local_b60 % 4 == 0)) {
    local_b74 = 4;
  }
  local_b80 = (local_b58 / (ulong)(long)local_b5c) * (long)local_b74;
  local_b88 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_998,0);
  Mat::create(in_stack_ffffffffffffed70,(int)((ulong)in_stack_ffffffffffffed68 >> 0x20),
              (int)in_stack_ffffffffffffed68,(int)(in_stack_ffffffffffffed60 >> 0x20),
              in_stack_ffffffffffffed58,(int)((ulong)in_stack_ffffffffffffed50 >> 0x20),
              (Allocator *)in_stack_ffffffffffffedd0);
  local_960 = local_b88;
  bVar5 = true;
  if (local_b88->data != (void *)0x0) {
    local_648 = local_b88;
    bVar5 = local_b88->cstep * (long)local_b88->c == 0;
  }
  if (bVar5) {
    return -100;
  }
  local_8b0 = &local_bd0;
  local_8b8 = local_b88;
  local_bd0 = local_b88->data;
  local_bc8 = local_b88->refcount;
  local_bc0 = local_b88->elemsize;
  local_bb8 = local_b88->elempack;
  local_bb0 = local_b88->allocator;
  local_ba8 = local_b88->dims;
  local_ba4 = local_b88->w;
  local_ba0 = local_b88->h;
  local_b9c = local_b88->d;
  local_b98 = local_b88->c;
  local_b90 = local_b88->cstep;
  if (local_bc8 != (int *)0x0) {
    local_61c = 1;
    LOCK();
    local_620 = *local_bc8;
    *local_bc8 = *local_bc8 + 1;
    UNLOCK();
  }
  local_618 = local_8b0;
  if (local_b5c < local_b74) {
    Mat::create(in_stack_ffffffffffffed70,(int)((ulong)in_stack_ffffffffffffed68 >> 0x20),
                (int)in_stack_ffffffffffffed68,(int)(in_stack_ffffffffffffed60 >> 0x20),
                in_stack_ffffffffffffed58,(int)((ulong)in_stack_ffffffffffffed50 >> 0x20),
                (Allocator *)in_stack_ffffffffffffedd0);
    local_968 = &local_bd0;
    if (local_bd0 != (void *)0x0) {
      local_640 = local_968;
    }
    if (local_bd0 != (void *)0x0 && local_b90 * (long)local_b98 != 0) goto LAB_00207b8d;
    local_97c = -100;
    local_a98 = 1;
  }
  else {
LAB_00207b8d:
    local_bd4 = 0;
    for (local_be0 = 0; uVar6 = local_be0,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_990), uVar6 < sVar2;
        local_be0 = local_be0 + 1) {
      local_be8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_990,local_be0);
      if ((local_be8->elempack == 4) && (local_b5c == 1)) {
        local_bec = local_be8->w * local_be8->h;
        for (local_bf0 = 0; local_bf0 < local_be8->c; local_bf0 = local_bf0 + 1) {
          local_758 = &local_c40;
          local_11c = local_be8->w;
          local_120 = local_be8->h;
          local_124 = local_be8->d;
          local_130 = (undefined4 *)
                      ((long)local_be8->data +
                      local_be8->cstep * (long)local_bf0 * local_be8->elemsize);
          local_138 = local_be8->elemsize;
          local_13c = local_be8->elempack;
          local_148 = local_be8->allocator;
          local_118 = &local_c40;
          local_78 = (long)local_11c * (long)local_120 * local_138;
          local_8e0 = &local_c40;
          local_868 = &local_c40;
          local_678 = &local_c90;
          local_680 = &local_bd0;
          local_2b8 = (undefined4 *)((long)local_bd0 + local_b90 * (long)local_bd4 * local_bc0);
          local_2a0 = &local_c90;
          local_8 = (long)local_ba4 * (long)local_ba0 * local_bc0;
          local_908 = &local_c90;
          local_858 = &local_c90;
          local_6a4 = local_bd4 + 1;
          local_698 = &local_ce0;
          local_6a0 = &local_bd0;
          local_280 = (undefined4 *)((long)local_bd0 + local_b90 * (long)local_6a4 * local_bc0);
          local_268 = &local_ce0;
          local_18 = (long)local_ba4 * (long)local_ba0 * local_bc0;
          local_910 = &local_ce0;
          local_848 = &local_ce0;
          local_6c4 = local_bd4 + 2;
          local_6b8 = &local_d30;
          local_6c0 = &local_bd0;
          local_248 = (undefined4 *)((long)local_bd0 + local_b90 * (long)local_6c4 * local_bc0);
          local_230 = &local_d30;
          local_28 = (long)local_ba4 * (long)local_ba0 * local_bc0;
          local_918 = &local_d30;
          local_838 = &local_d30;
          local_c08 = 0;
          local_c0c = 0;
          local_c10 = 0;
          local_c14 = 0;
          local_c28 = 0;
          local_c30 = 0;
          local_c38 = 0;
          local_c40 = 0;
          local_c58 = 0;
          local_c5c = 0;
          local_c60 = 0;
          local_c64 = 0;
          local_c70 = local_bb0;
          local_c78 = 0;
          local_c80 = 0;
          local_c88 = 0;
          local_c90 = 0;
          local_ca8 = 0;
          local_cac = 0;
          local_cb0 = 0;
          local_cb4 = 0;
          local_cc0 = local_bb0;
          local_cc8 = 0;
          local_cd0 = 0;
          local_cd8 = 0;
          local_ce0 = 0;
          local_d10 = local_bb0;
          local_c = 0x10;
          local_1c = 0x10;
          local_2c = 0x10;
          local_7c = 0x10;
          local_234 = local_ba4;
          local_238 = local_ba0;
          local_23c = local_b9c;
          local_250 = local_bc0;
          local_254 = local_bb8;
          local_260 = local_bb0;
          local_26c = local_ba4;
          local_270 = local_ba0;
          local_274 = local_b9c;
          local_288 = local_bc0;
          local_28c = local_bb8;
          local_298 = local_bb0;
          local_2a4 = local_ba4;
          local_2a8 = local_ba0;
          local_2ac = local_b9c;
          local_2c0 = local_bc0;
          local_2c4 = local_bb8;
          local_2d0 = local_bb0;
          local_684 = local_bd4;
          local_685 = 1;
          local_6a5 = 1;
          local_6c5 = 1;
          local_764 = local_bf0;
          local_765 = 1;
          local_c00 = 0;
          local_c18 = 0;
          local_c50 = 0;
          local_c68 = 0;
          local_ca0 = 0;
          local_cb8 = 0;
          local_d30 = 0;
          local_d20 = 0;
          local_d18 = 0;
          local_d04 = 0;
          local_d00 = 0;
          local_cfc = 0;
          local_cf8 = 0;
          local_d28 = 0;
          local_6e4 = local_bd4 + 3;
          local_6d8 = &local_d80;
          local_6e0 = &local_bd0;
          local_210 = (undefined4 *)((long)local_bd0 + local_b90 * (long)local_6e4 * local_bc0);
          local_1f8 = &local_d80;
          local_d60 = local_bb0;
          local_38 = (long)local_ba4 * (long)local_ba0 * local_bc0;
          local_3c = 0x10;
          local_1fc = local_ba4;
          local_200 = local_ba0;
          local_204 = local_b9c;
          local_218 = local_bc0;
          local_21c = local_bb8;
          local_228 = local_bb0;
          local_6e5 = 1;
          local_cf0 = 0;
          local_d08 = 0;
          local_920 = &local_d80;
          local_828 = &local_d80;
          local_d80 = 0;
          local_d70 = 0;
          local_d68 = 0;
          local_d58 = 0;
          local_d54 = 0;
          local_d50 = 0;
          local_d4c = 0;
          local_d48 = 0;
          local_d40 = 0;
          local_d78 = 0;
          local_d38 = local_210;
          local_ce8 = local_248;
          local_c98 = local_280;
          local_c48 = local_2b8;
          local_bf8 = local_130;
          for (local_d84 = 0; local_d84 < local_bec; local_d84 = local_d84 + 1) {
            *local_c48 = *local_bf8;
            *local_c98 = local_bf8[1];
            *local_ce8 = local_bf8[2];
            *local_d38 = local_bf8[3];
            local_bf8 = local_bf8 + 4;
            local_d38 = local_d38 + 1;
            local_ce8 = local_ce8 + 1;
            local_c98 = local_c98 + 1;
            local_c48 = local_c48 + 1;
          }
          local_bd4 = local_bd4 + 4;
          local_760 = local_be8;
          local_488 = local_828;
          local_468 = local_838;
          local_448 = local_848;
          local_428 = local_858;
          local_408 = local_868;
          local_c20 = local_148;
        }
      }
      if (local_be8->elempack == local_b5c) {
        local_d88 = (int)local_be8->cstep * local_be8->c;
        local_d90 = local_be8->data;
        local_6f8 = &local_de0;
        local_700 = &local_bd0;
        local_d98 = (void *)((long)local_bd0 + local_b90 * (long)local_bd4 * local_bc0);
        local_1c0 = &local_de0;
        local_48 = (long)local_ba4 * (long)local_ba0 * local_bc0;
        local_928 = &local_de0;
        local_818 = &local_de0;
        local_dc0 = local_bb0;
        local_4c = 0x10;
        local_1c4 = local_ba4;
        local_1c8 = local_ba0;
        local_1cc = local_b9c;
        local_1e0 = local_bc0;
        local_1e4 = local_bb8;
        local_1f0 = local_bb0;
        local_704 = local_bd4;
        local_705 = 1;
        local_de0 = 0;
        local_dd0 = 0;
        local_dc8 = 0;
        local_db8 = 0;
        local_db4 = 0;
        local_db0 = 0;
        local_dac = 0;
        local_da8 = 0;
        local_da0 = 0;
        local_dd8 = 0;
        local_8e8 = local_be8;
        local_628 = local_be8;
        local_4a8 = local_818;
        local_1d8 = local_d98;
        memcpy(local_d98,local_d90,(long)local_d88 * local_be8->elemsize);
        local_bd4 = local_be8->c + local_bd4;
      }
    }
    if (local_b5c < local_b74) {
      convert_packing(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78,
                      (int)((ulong)in_stack_ffffffffffffed70 >> 0x20),in_stack_ffffffffffffed68);
    }
    local_a98 = 0;
  }
  local_808 = &local_bd0;
  local_4c8 = local_808;
  if (local_bc8 != (int *)0x0) {
    local_4cc = 0xffffffff;
    LOCK();
    local_4d0 = *local_bc8;
    *local_bc8 = *local_bc8 + -1;
    UNLOCK();
    if (local_4d0 == 1) {
      if (local_bb0 == (Allocator *)0x0) {
        local_370 = local_bd0;
        if (local_bd0 != (void *)0x0) {
          free(local_bd0);
        }
      }
      else {
        (*local_bb0->_vptr_Allocator[3])(local_bb0,local_bd0);
      }
    }
  }
  local_bd0 = (void *)0x0;
  local_bc0 = 0;
  local_bb8 = 0;
  local_ba8 = 0;
  local_ba4 = 0;
  local_ba0 = 0;
  local_b9c = 0;
  local_b98 = 0;
  local_b90 = 0;
  local_bc8 = (int *)0x0;
  if (local_a98 != 0) {
    return local_97c;
  }
LAB_00209b00:
  if ((local_9a4 == 3) && (local_9a8 == 1)) {
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
    local_de4 = pvVar1->w;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
    local_de8 = pvVar1->c;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
    local_df0 = pvVar1->elemsize;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
    local_df4 = pvVar1->elempack;
    local_df8 = 0;
    for (local_e00 = 0; uVar6 = local_e00,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_990), uVar6 < sVar2;
        local_e00 = local_e00 + 1) {
      local_e08 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_990,local_e00);
      local_df8 = local_e08->h + local_df8;
    }
    local_e10 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_998,0);
    Mat::create(in_stack_ffffffffffffed70,(int)((ulong)in_stack_ffffffffffffed68 >> 0x20),
                (int)in_stack_ffffffffffffed68,(int)(in_stack_ffffffffffffed60 >> 0x20),
                in_stack_ffffffffffffed58,(int)((ulong)in_stack_ffffffffffffed50 >> 0x20),
                (Allocator *)in_stack_ffffffffffffedd0);
    local_970 = local_e10;
    bVar5 = true;
    if (local_e10->data != (void *)0x0) {
      local_638 = local_e10;
      bVar5 = local_e10->cstep * (long)local_e10->c == 0;
    }
    if (bVar5) {
      return -100;
    }
    for (local_e14 = 0; local_e14 < local_de8; local_e14 = local_e14 + 1) {
      local_718 = &local_e68;
      local_18c = local_e10->w;
      local_190 = local_e10->h;
      local_194 = local_e10->d;
      local_e20 = (void *)((long)local_e10->data +
                          local_e10->cstep * (long)local_e14 * local_e10->elemsize);
      local_1a8 = local_e10->elemsize;
      local_1ac = local_e10->elempack;
      local_1b8 = local_e10->allocator;
      local_188 = &local_e68;
      local_58 = (long)local_18c * (long)local_190 * local_1a8;
      local_930 = &local_e68;
      local_7f8 = &local_e68;
      local_5c = 0x10;
      local_720 = local_e10;
      local_724 = local_e14;
      local_725 = 1;
      local_e68 = 0;
      local_e58 = 0;
      local_e50 = 0;
      local_e40 = 0;
      local_e3c = 0;
      local_e38 = 0;
      local_e34 = 0;
      local_e30 = 0;
      local_e28 = 0;
      local_e60 = 0;
      local_4e8 = local_7f8;
      local_1a0 = local_e20;
      local_e48 = local_1b8;
      for (local_e70 = 0; uVar6 = local_e70,
          sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_990), uVar6 < sVar2
          ; local_e70 = local_e70 + 1) {
        in_stack_ffffffffffffedd0 =
             std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,local_e70);
        local_e7c = in_stack_ffffffffffffedd0->w * in_stack_ffffffffffffedd0->h;
        local_778 = &local_ed0;
        local_e4 = in_stack_ffffffffffffedd0->w;
        local_e8 = in_stack_ffffffffffffedd0->h;
        local_ec = in_stack_ffffffffffffedd0->d;
        local_e88 = (void *)((long)in_stack_ffffffffffffedd0->data +
                            in_stack_ffffffffffffedd0->cstep * (long)local_e14 *
                            in_stack_ffffffffffffedd0->elemsize);
        local_100 = in_stack_ffffffffffffedd0->elemsize;
        local_104 = in_stack_ffffffffffffedd0->elempack;
        local_110 = in_stack_ffffffffffffedd0->allocator;
        local_e0 = &local_ed0;
        local_88 = (long)local_e4 * (long)local_e8 * local_100;
        local_8f0 = &local_ed0;
        local_7e8 = &local_ed0;
        local_8c = 0x10;
        local_784 = local_e14;
        local_785 = 1;
        local_ed0 = 0;
        local_ec0 = 0;
        local_eb8 = 0;
        local_ea8 = 0;
        local_ea4 = 0;
        local_ea0 = 0;
        local_e9c = 0;
        local_e98 = 0;
        local_e90 = 0;
        local_ec8 = 0;
        local_e78 = in_stack_ffffffffffffedd0;
        local_780 = in_stack_ffffffffffffedd0;
        local_508 = local_7e8;
        local_f8 = local_e88;
        local_eb0 = local_110;
        memcpy(local_e20,local_e88,(long)local_e7c * local_df0);
        local_e20 = (void *)((long)local_e20 + (long)(local_e7c * local_df4) * 4);
      }
    }
  }
  if ((local_9a4 == 3) && (local_9a8 == 2)) {
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
    local_ed4 = pvVar1->h;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
    local_ed8 = pvVar1->c;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
    local_ee0 = pvVar1->elemsize;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_990,0);
    local_ee4 = pvVar1->elempack;
    local_ee8 = 0;
    local_ef0 = 0;
    while( true ) {
      uVar6 = local_ef0;
      sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_990);
      _c = (int)(in_stack_ffffffffffffed60 >> 0x20);
      _elempack = (int)((ulong)in_stack_ffffffffffffed50 >> 0x20);
      if (sVar2 <= uVar6) break;
      local_ef8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_990,local_ef0);
      local_ee8 = local_ef8->w + local_ee8;
      local_ef0 = local_ef0 + 1;
    }
    local_f00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_998,0);
    Mat::create(in_stack_ffffffffffffed70,(int)((ulong)in_stack_ffffffffffffed68 >> 0x20),
                (int)in_stack_ffffffffffffed68,_c,in_stack_ffffffffffffed58,_elempack,
                (Allocator *)in_stack_ffffffffffffedd0);
    local_978 = local_f00;
    bVar5 = true;
    if (local_f00->data != (void *)0x0) {
      local_630 = local_f00;
      bVar5 = local_f00->cstep * (long)local_f00->c == 0;
    }
    if (bVar5) {
      return -100;
    }
    for (local_f04 = 0; local_f04 < local_ed8; local_f04 = local_f04 + 1) {
      local_738 = &local_f58;
      local_154 = local_f00->w;
      local_158 = local_f00->h;
      local_15c = local_f00->d;
      local_f10 = (void *)((long)local_f00->data +
                          local_f00->cstep * (long)local_f04 * local_f00->elemsize);
      local_170 = local_f00->elemsize;
      local_174 = local_f00->elempack;
      local_180 = local_f00->allocator;
      local_150 = &local_f58;
      local_68 = (long)local_154 * (long)local_158 * local_170;
      local_938 = &local_f58;
      local_7d8 = &local_f58;
      local_6c = 0x10;
      local_740 = local_f00;
      local_744 = local_f04;
      local_745 = 1;
      local_f58 = 0;
      local_f48 = 0;
      local_f40 = 0;
      local_f30 = 0;
      local_f2c = 0;
      local_f28 = 0;
      local_f24 = 0;
      local_f20 = 0;
      local_f18 = 0;
      local_f50 = 0;
      local_528 = local_7d8;
      local_168 = local_f10;
      local_f38 = local_180;
      for (local_f5c = 0; local_f5c < local_ed4; local_f5c = local_f5c + 1) {
        local_f68 = 0;
        while (uVar6 = local_f68,
              sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_990),
              uVar6 < sVar2) {
          local_f70 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_990,local_f68);
          local_798 = &local_fc0;
          local_ac = local_f70->w;
          local_b0 = local_f70->h;
          local_b4 = local_f70->d;
          local_c0 = (void *)((long)local_f70->data +
                             local_f70->cstep * (long)local_f04 * local_f70->elemsize);
          local_c8 = local_f70->elemsize;
          local_cc = local_f70->elempack;
          local_d8 = local_f70->allocator;
          local_a8 = &local_fc0;
          local_98 = (long)local_ac * (long)local_b0 * local_c8;
          local_8a0 = &local_fc0;
          local_f78 = (void *)((long)local_c0 + (long)local_ac * (long)local_f5c * local_c8);
          local_7c8 = &local_fc0;
          local_9c = 0x10;
          local_7a4 = local_f04;
          local_7a5 = 1;
          local_8a4 = local_f5c;
          local_fc0 = 0;
          local_fb0 = 0;
          local_fa8 = 0;
          local_f98 = 0;
          local_f94 = 0;
          local_f90 = 0;
          local_f8c = 0;
          local_f88 = 0;
          local_f80 = 0;
          local_fb8 = 0;
          local_7a0 = local_f70;
          local_548 = local_7c8;
          local_fa0 = local_d8;
          memcpy(local_f10,local_f78,(long)local_f70->w * local_ee0);
          local_f10 = (void *)((long)local_f10 + (long)(local_f70->w * local_ee4) * 4);
          local_f68 = local_f68 + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Concat_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_w % 16 == 0 ? 16 : top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_w % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, bottom_blob.w * bottom_blob.elemsize);

            outptr += bottom_blob.w * bottom_blob.elempack;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_h += bottom_blob.h * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_h % 16 == 0 ? 16 : top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_h % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, top_h / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        float* outptr = top_blob_unpacked;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
#if __AVX512F__
            if (bottom_blob.elempack == 16 && elempack == 8)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 8;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr1[0] = r0[8];
                        outptr1[1] = r0[9];
                        outptr1[2] = r0[10];
                        outptr1[3] = r0[11];
                        outptr1[4] = r0[12];
                        outptr1[5] = r0[13];
                        outptr1[6] = r0[14];
                        outptr1[7] = r0[15];

                        outptr0 += 8;
                        outptr1 += 8;
                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;
                    float* outptr2 = outptr + w * 8;
                    float* outptr3 = outptr + w * 12;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];
                        outptr2[0] = r0[8];
                        outptr2[1] = r0[9];
                        outptr2[2] = r0[10];
                        outptr2[3] = r0[11];
                        outptr3[0] = r0[12];
                        outptr3[1] = r0[13];
                        outptr3[2] = r0[14];
                        outptr3[3] = r0[15];

                        outptr0 += 4;
                        outptr1 += 4;
                        outptr2 += 4;
                        outptr3 += 4;
                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;
                    float* outptr8 = outptr + w * 8;
                    float* outptr9 = outptr + w * 9;
                    float* outptra = outptr + w * 10;
                    float* outptrb = outptr + w * 11;
                    float* outptrc = outptr + w * 12;
                    float* outptrd = outptr + w * 13;
                    float* outptre = outptr + w * 14;
                    float* outptrf = outptr + w * 15;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];
                        *outptr8++ = r0[8];
                        *outptr9++ = r0[9];
                        *outptra++ = r0[10];
                        *outptrb++ = r0[11];
                        *outptrc++ = r0[12];
                        *outptrd++ = r0[13];
                        *outptre++ = r0[14];
                        *outptrf++ = r0[15];

                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
#endif // __AVX512F__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    outptr += w * 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8 16-16
            {
                int size = w * bottom_blob.h;

                const float* ptr = bottom_blob;
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                outptr += size * bottom_blob.elempack;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* outptr = top_blob.row(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const float* ptr = bottom_blob.row(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_channels += bottom_blob.c * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_channels % 16 == 0 ? 16 : top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, h, top_channels / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        int p = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
#if __AVX512F__
            if (bottom_blob.elempack == 16 && elempack == 8)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr1[0] = r0[8];
                        outptr1[1] = r0[9];
                        outptr1[2] = r0[10];
                        outptr1[3] = r0[11];
                        outptr1[4] = r0[12];
                        outptr1[5] = r0[13];
                        outptr1[6] = r0[14];
                        outptr1[7] = r0[15];

                        outptr0 += 8;
                        outptr1 += 8;
                        r0 += 16;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];
                        outptr2[0] = r0[8];
                        outptr2[1] = r0[9];
                        outptr2[2] = r0[10];
                        outptr2[3] = r0[11];
                        outptr3[0] = r0[12];
                        outptr3[1] = r0[13];
                        outptr3[2] = r0[14];
                        outptr3[3] = r0[15];

                        outptr0 += 4;
                        outptr1 += 4;
                        outptr2 += 4;
                        outptr3 += 4;
                        r0 += 16;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);
                    float* outptr8 = top_blob_unpacked.channel(p + 8);
                    float* outptr9 = top_blob_unpacked.channel(p + 9);
                    float* outptra = top_blob_unpacked.channel(p + 10);
                    float* outptrb = top_blob_unpacked.channel(p + 11);
                    float* outptrc = top_blob_unpacked.channel(p + 12);
                    float* outptrd = top_blob_unpacked.channel(p + 13);
                    float* outptre = top_blob_unpacked.channel(p + 14);
                    float* outptrf = top_blob_unpacked.channel(p + 15);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];
                        *outptr8++ = r0[8];
                        *outptr9++ = r0[9];
                        *outptra++ = r0[10];
                        *outptrb++ = r0[11];
                        *outptrc++ = r0[12];
                        *outptrd++ = r0[13];
                        *outptre++ = r0[14];
                        *outptrf++ = r0[15];

                        r0 += 16;
                    }

                    p += 16;
                }
            }
#endif // __AVX512F__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8
            {
                int size = bottom_blob.total();

                const float* ptr = bottom_blob;
                float* outptr = top_blob_unpacked.channel(p);
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                p += bottom_blob.c;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const float* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const float* ptr = bottom_blob.channel(q).row(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}